

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusSimulationDataGenerator.cpp
# Opt level: O1

void __thiscall
ModbusSimulationDataGenerator::SendException
          (ModbusSimulationDataGenerator *this,U8 DeviceID,U8 FuncCode,U8 ExceptionCode)

{
  ushort uVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  ModbusSimulationDataGenerator *pMVar5;
  ModbusSimulationDataGenerator *this_00;
  U64 value;
  
  if (this->mSettings->mModbusMode < ModbusASCIIClient) {
    CreateModbusByte(this,(ulong)DeviceID);
    uVar4 = (int)this + 0x30;
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar4);
    CreateModbusByte(this,(ulong)(FuncCode + 0x80));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar4);
    CreateModbusByte(this,(ulong)ExceptionCode);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar4);
    uVar1 = this->crc_tab16
            [(byte)((byte)(this->crc_tab16[(byte)~DeviceID] >> 8) ^
                    (byte)this->crc_tab16
                          [~(FuncCode + 0x80 ^ (uint)this->crc_tab16[(byte)~DeviceID]) & 0xff] ^
                   ExceptionCode)];
    CreateModbusByte(this,(ulong)((ushort)(this->crc_tab16
                                           [~(FuncCode + 0x80 ^
                                             (uint)this->crc_tab16[(byte)~DeviceID]) & 0xff] >> 8 ^
                                          uVar1) & 0xff));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar4);
    value = (U64)(uVar1 >> 8);
  }
  else {
    CreateModbusByte(this,0x3a);
    this_00 = (ModbusSimulationDataGenerator *)&this->mModbusSimulationData;
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    uVar4 = (uint)this_00;
    pMVar5 = this_00;
    SimulationChannelDescriptor::Advance(uVar4);
    bVar2 = BinToLATIN1(pMVar5,DeviceID >> 4);
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar5 = this_00;
    SimulationChannelDescriptor::Advance(uVar4);
    bVar2 = BinToLATIN1(pMVar5,DeviceID & 0xf);
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar5 = this_00;
    SimulationChannelDescriptor::Advance(uVar4);
    bVar2 = BinToLATIN1(pMVar5,(U8)(FuncCode + 0x80 >> 4));
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar5 = this_00;
    SimulationChannelDescriptor::Advance(uVar4);
    bVar2 = BinToLATIN1(pMVar5,FuncCode & 0xf);
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar5 = this_00;
    SimulationChannelDescriptor::Advance(uVar4);
    bVar2 = BinToLATIN1(pMVar5,ExceptionCode >> 4);
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar5 = this_00;
    SimulationChannelDescriptor::Advance(uVar4);
    bVar2 = BinToLATIN1(pMVar5,ExceptionCode & 0xf);
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar5 = this_00;
    SimulationChannelDescriptor::Advance(uVar4);
    bVar3 = -(DeviceID + ExceptionCode + (char)(FuncCode + 0x80));
    bVar2 = BinToLATIN1(pMVar5,bVar3 >> 4);
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar4);
    bVar2 = BinToLATIN1(this_00,bVar3 & 0xf);
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar4);
    CreateModbusByte(this,0xd);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar4);
    value = 10;
  }
  CreateModbusByte(this,value);
  ClockGenerator::AdvanceByHalfPeriod(10.0);
  SimulationChannelDescriptor::Advance((int)this + 0x30);
  return;
}

Assistant:

void ModbusSimulationDataGenerator::SendException( U8 DeviceID, U8 FuncCode, U8 ExceptionCode )
{
    if( mSettings->mModbusMode == ModbusAnalyzerEnums::ModbusRTUClient || mSettings->mModbusMode == ModbusAnalyzerEnums::ModbusRTUServer )
    {
        CreateModbusByte( DeviceID );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( FuncCode + 0x80 );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ExceptionCode );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        U16 CRCValue = 0xFFFF; // Modbus/RTU uses CRC-16, calls for initialization to 0xFFFF
        CRCValue = update_CRC( CRCValue, DeviceID );
        CRCValue = update_CRC( CRCValue, ( FuncCode + 0x80 ) );
        CRCValue = update_CRC( CRCValue, ExceptionCode );

        CreateModbusByte( ( CRCValue & 0x00FF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ( ( CRCValue & 0xFF00 ) >> 8 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle
    }
    else
    {
        // it's easier to compute the LRC before converting the data from binary to ASCII
        U16 LRCvalue = 0x00; // Modbus/ASCII uses LRC, initialization to 0x00;

        LRCvalue = LRCvalue + DeviceID;
        LRCvalue = LRCvalue + ( FuncCode + 0x80 );
        LRCvalue = LRCvalue + ( ExceptionCode );

        LRCvalue = ~LRCvalue + 1;
        LRCvalue = LRCvalue & 0x00FF;

        CreateModbusByte( ':' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( DeviceID >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( DeviceID & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( FuncCode + 0x80 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( FuncCode & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( ExceptionCode & 0x00F0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ExceptionCode & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( LRCvalue & 0xF0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( LRCvalue & 0xF ) ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( '\r' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( '\n' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
    }
}